

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PedestriansWalkingAnEight.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_70a26::PedestrianPlugIn::handleFunctionKeys(PedestrianPlugIn *this,int keyNumber)

{
  undefined4 in_ESI;
  PedestrianPlugIn *unaff_retaddr;
  PedestrianPlugIn *in_stack_00000080;
  undefined4 in_stack_fffffffffffffff0;
  
  switch(in_ESI) {
  case 1:
    addPedestrianToCrowd(unaff_retaddr);
    break;
  case 2:
    removePedestrianFromCrowd((PedestrianPlugIn *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    break;
  case 3:
    nextPD(in_stack_00000080);
    break;
  case 4:
    (anonymous_namespace)::gUseDirectedPathFollowing =
         ((anonymous_namespace)::gUseDirectedPathFollowing ^ 0xff) & 1;
    break;
  case 5:
    (anonymous_namespace)::gWanderSwitch = ((anonymous_namespace)::gWanderSwitch ^ 0xff) & 1;
  }
  return;
}

Assistant:

void handleFunctionKeys (int keyNumber)
    {
        switch (keyNumber)
        {
            case 1:  addPedestrianToCrowd ();                               break;
            case 2:  removePedestrianFromCrowd ();                          break;
            case 3:  nextPD ();                                             break;
            case 4: gUseDirectedPathFollowing = !gUseDirectedPathFollowing; break;
            case 5: gWanderSwitch = !gWanderSwitch;                         break;
        }
    }